

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O0

void bcread_uv(LexState *ls,GCproto *pt,MSize sizeuv)

{
  ulong uVar1;
  uint in_EDX;
  LexState *in_RSI;
  long in_RDI;
  MSize i;
  uint16_t *uv;
  uint local_24;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (in_EDX != 0) {
    uVar1 = (ulong)(in_RSI->tokenval).field_2.it;
    bcread_block(in_RSI,(void *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
    if ((*(uint *)(in_RDI + 0x94) & 1) != 0) {
      for (local_24 = 0; local_24 < in_EDX; local_24 = local_24 + 1) {
        *(ushort *)(uVar1 + (ulong)local_24 * 2) =
             *(ushort *)(uVar1 + (ulong)local_24 * 2) >> 8 |
             *(short *)(uVar1 + (ulong)local_24 * 2) << 8;
      }
    }
  }
  return;
}

Assistant:

static void bcread_uv(LexState *ls, GCproto *pt, MSize sizeuv)
{
  if (sizeuv) {
    uint16_t *uv = proto_uv(pt);
    bcread_block(ls, uv, sizeuv*2);
    /* Swap upvalue refs if the endianess differs. */
    if (bcread_swap(ls)) {
      MSize i;
      for (i = 0; i < sizeuv; i++)
	uv[i] = (uint16_t)((uv[i] >> 8)|(uv[i] << 8));
    }
  }
}